

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

string * __thiscall
cmWatchpoint::GetTypeAsString_abi_cxx11_
          (string *__return_storage_ptr__,cmWatchpoint *this,WatchpointType type)

{
  ulong uVar1;
  ulong extraout_RDX;
  char *pcVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar1 = (ulong)type;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "NONE";
    break;
  case 1:
    pcVar2 = "DEFINE";
    break;
  case 2:
    pcVar2 = "WRITE";
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      if ((*(uint *)((long)&DAT_00516a2c + lVar3) & (uint)this) != 0) {
        GetTypeAsString_abi_cxx11_
                  (&local_50,(cmWatchpoint *)(ulong)*(uint *)((long)&DAT_00516a2c + lVar3),
                   (WatchpointType)uVar1);
        std::operator+(&local_70,&local_50,", ");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        uVar1 = extraout_RDX;
      }
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      return __return_storage_ptr__;
    }
    __assert_fail("!rtn.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmDebugger.cxx"
                  ,0x23d,
                  "static std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType)");
  case 4:
    pcVar2 = "READ";
    break;
  case 8:
    pcVar2 = "UNDEFINED";
    break;
  case 0xb:
    pcVar2 = "MODIFY";
    break;
  case 0xf:
    pcVar2 = "ALL";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string cmWatchpoint::GetTypeAsString(cmWatchpoint::WatchpointType type)
{
  switch (type) {
    case WATCHPOINT_NONE:
      return "NONE";
    case WATCHPOINT_ALL:
      return "ALL";
    case WATCHPOINT_MODIFY:
      return "MODIFY";
    case WATCHPOINT_DEFINE:
      return "DEFINE";
    case WATCHPOINT_READ:
      return "READ";
    case WATCHPOINT_UNDEFINED:
      return "UNDEFINED";
    case WATCHPOINT_WRITE:
      return "WRITE";
    default:
      break;
  }

  std::string rtn;
  for (auto field : { WATCHPOINT_WRITE, WATCHPOINT_UNDEFINED, WATCHPOINT_READ,
                      WATCHPOINT_DEFINE, WATCHPOINT_MODIFY, WATCHPOINT_ALL }) {
    if (field & type) {
      rtn += GetTypeAsString(field) + ", ";
    }
  }

  // If it doesn't match any of the bits in the field or none, what exactly was
  // passed in?
  assert(!rtn.empty());

  // Remove last comma and space
  if (!rtn.empty()) {
    rtn.pop_back();
    rtn.pop_back();
  }

  return rtn;
}